

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall A::A(A *this,A *param_1)

{
  pointer pcVar1;
  
  this->i = param_1->i;
  (this->s)._M_dataplus._M_p = (pointer)&(this->s).field_2;
  pcVar1 = (param_1->s)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->s,pcVar1,pcVar1 + (param_1->s)._M_string_length);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->vi,&param_1->vi);
  std::_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  ::_Rb_tree(&(this->seti)._M_t,&(param_1->seti)._M_t);
  std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>::vector
            (&this->v,&param_1->v);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_Rb_tree(&(this->mm)._M_t,&(param_1->mm)._M_t);
  return;
}

Assistant:

void hibernate(Archive & ar)
	{
		ar & HIBERLITE_NVP(seti);
		ar & HIBERLITE_NVP(i);
		ar & HIBERLITE_NVP(s);
		ar & HIBERLITE_NVP(vi);
		ar & HIBERLITE_NVP(v);
		ar & HIBERLITE_NVP(mm);
	}